

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void softHSMLog(int loglevel,char *functionName,char *fileName,int lineNo,char *format,...)

{
  int __pri;
  char in_AL;
  ostream *this;
  ostream *this_00;
  ostream *this_01;
  reference pvVar1;
  undefined8 uVar2;
  int in_ECX;
  char *in_RDX;
  undefined8 in_RSI;
  int in_EDI;
  char *in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  vector<char,_std::allocator<char>_> logMessage;
  stringstream prepend;
  undefined1 local_2c8 [40];
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 local_258;
  undefined8 local_248;
  undefined8 local_238;
  undefined8 local_228;
  string local_218 [32];
  undefined4 local_1f8;
  undefined4 local_1f4;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  vector<char,_std::allocator<char>_> local_1d8;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  char *local_28;
  int local_1c;
  char *local_18;
  undefined8 local_10;
  int local_4;
  
  if (in_AL != '\0') {
    local_298 = in_XMM0_Qa;
    local_288 = in_XMM1_Qa;
    local_278 = in_XMM2_Qa;
    local_268 = in_XMM3_Qa;
    local_258 = in_XMM4_Qa;
    local_248 = in_XMM5_Qa;
    local_238 = in_XMM6_Qa;
    local_228 = in_XMM7_Qa;
  }
  if (in_EDI <= softLogLevel) {
    local_2a0 = in_R9;
    local_28 = in_R8;
    local_1c = in_ECX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_4 = in_EDI;
    std::__cxx11::stringstream::stringstream(local_1b0);
    this = std::operator<<(local_1a0,local_18);
    this_00 = std::operator<<(this,"(");
    this_01 = (ostream *)std::ostream::operator<<(this_00,local_1c);
    std::operator<<(this_01,")");
    std::operator<<(local_1a0,":");
    std::operator<<(local_1a0," ");
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)0x11fe0e);
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)this,(size_type)this_00);
    local_1e8 = local_2c8;
    local_1f0 = &stack0x00000008;
    local_1f4 = 0x30;
    local_1f8 = 0x28;
    pvVar1 = std::vector<char,_std::allocator<char>_>::operator[](&local_1d8,0);
    vsnprintf(pvVar1,0x1000,local_28,&local_1f8);
    __pri = local_4;
    std::__cxx11::stringstream::str();
    uVar2 = std::__cxx11::string::c_str();
    pvVar1 = std::vector<char,_std::allocator<char>_>::operator[](&local_1d8,0);
    syslog(__pri,"%s%s",uVar2,pvVar1);
    std::__cxx11::string::~string(local_218);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)this_01);
    std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  return;
}

Assistant:

void softHSMLog(const int loglevel, const char* functionName, const char* fileName, const int lineNo, const char* format, ...)
{
	if (loglevel > softLogLevel) return;

	std::stringstream prepend;

#ifdef SOFTHSM_LOG_FILE_AND_LINE
	prepend << fileName << "(" << lineNo << ")";
#ifndef SOFTHSM_LOG_FUNCTION_NAME
	(void) functionName;
	prepend << ":";
#endif // !SOFTHSM_LOG_FUNCTION_NAME
	prepend << " ";
#endif // SOFTHSM_LOG_FILE_AND_LINE

#ifdef SOFTHSM_LOG_FUNCTION_NAME
	prepend << functionName << ": ";
#endif // SOFTHSM_LOG_FUNCTION_NAME

	// Print the format to a log message
	std::vector<char> logMessage;
	va_list args;

	logMessage.resize(4096);

	va_start(args, format);
	vsnprintf(&logMessage[0], 4096, format, args);
	va_end(args);

	// And log it
	syslog(loglevel, "%s%s", prepend.str().c_str(), &logMessage[0]);

#ifdef DEBUG_LOG_STDERR
	fprintf(stderr, "%s%s\n", prepend.str().c_str(), &logMessage[0]);
	fflush(stderr);
#endif // DEBUG_LOG_STDERR
}